

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchWebsocket.cpp
# Opt level: O0

void sendPacket(PTR *session,char *data,size_t len)

{
  char *payload;
  size_t payloadLen;
  element_type *frame_00;
  element_type *peVar1;
  function<void_()> local_4a0;
  undefined1 local_480 [8];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> frame
  ;
  undefined1 local_460 [8];
  BasePacketWriter bw;
  char buff [1024];
  size_t len_local;
  char *data_local;
  PTR *session_local;
  
  BasePacketWriter::BasePacketWriter
            ((BasePacketWriter *)local_460,(char *)&bw.mMallocBuffer,0x400,true,true);
  BasePacketWriter::writeINT8((BasePacketWriter *)local_460,'{');
  BasePacketWriter::writeBuffer((BasePacketWriter *)local_460,"\"data\":\"",8);
  BasePacketWriter::writeBuffer((BasePacketWriter *)local_460,data,len);
  BasePacketWriter::writeINT8((BasePacketWriter *)local_460,'\"');
  BasePacketWriter::writeINT8((BasePacketWriter *)local_460,'}');
  std::make_shared<std::__cxx11::string>();
  payload = BasePacketWriter::getData((BasePacketWriter *)local_460);
  payloadLen = BasePacketWriter::getPos((BasePacketWriter *)local_460);
  frame_00 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_480);
  brynet::net::WebSocketFormat::wsFrameBuild(payload,payloadLen,frame_00,TEXT_FRAME,true,true);
  peVar1 = std::
           __shared_ptr_access<brynet::net::HttpSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<brynet::net::HttpSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)session);
  std::function<void_()>::function(&local_4a0,(nullptr_t)0x0);
  brynet::net::HttpSession::send((shared_ptr *)peVar1,local_480);
  std::function<void_()>::~function(&local_4a0);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_480);
  BasePacketWriter::~BasePacketWriter((BasePacketWriter *)local_460);
  return;
}

Assistant:

static void sendPacket(HttpSession::PTR session, const char* data, size_t len)
{
    char buff[1024];
    BasePacketWriter bw(buff, sizeof(buff), true, true);
    bw.writeINT8('{');
    bw.writeBuffer("\"data\":\"", 8);
    bw.writeBuffer(data, len);
    bw.writeINT8('"');
    bw.writeINT8('}');

    auto frame = std::make_shared<std::string>();
    WebSocketFormat::wsFrameBuild(bw.getData(), bw.getPos(), *frame, WebSocketFormat::WebSocketFrameType::TEXT_FRAME, true, true);
    session->send(frame);
}